

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat_solver.cpp
# Opt level: O0

Literal __thiscall Satyricon::SATSolver::choice_lit(SATSolver *this)

{
  ulong uVar1;
  reference pvVar2;
  int v;
  int val;
  SATSolver *this_local;
  
  if ((((this->param).enable_random_choice & 1U) == 0) ||
     (uVar1 = random(this), (int)((uVar1 & 0xffffffff) % 100) != 0)) {
    this_local._4_4_ = Literal_Order::decision(&this->order);
  }
  else {
    do {
      uVar1 = random(this);
      v = (int)((uVar1 & 0xffffffff) % (ulong)this->number_of_variable);
      pvVar2 = std::vector<Satyricon::literal_value,_std::allocator<Satyricon::literal_value>_>::
               operator[](&this->values,(long)v);
    } while (*pvVar2 != LIT_UNASIGNED);
    uVar1 = random(this);
    Literal::Literal((Literal *)((long)&this_local + 4),v,(uVar1 & 1) != 0);
  }
  return (Literal)this_local._4_4_;
}

Assistant:

Literal SATSolver::choice_lit() {

    // random choice 1% of times
    if ( param.enable_random_choice &&  random() % 100 == 0 ) {
        int val;
        do {
            val = random() % number_of_variable;
        } while ( values[val] != LIT_UNASIGNED );
        return Literal ( val,static_cast<bool>(random() % 2) ) ;
    }

    // otherwise select from order
    return order.decision();
}